

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall
myEmployeeCustomConstructor::ArchiveIN(myEmployeeCustomConstructor *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_28;
  
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveIN(&this->super_myEmployee,marchive);
  local_28._value = &this->legs;
  local_28._name = "legs";
  local_28._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();
        // remember to deserialize the parent class data too!!!
        myEmployee::ArchiveIN(marchive);
        // stream in member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive >> CHNVP(legs);
    }